

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupRemovePis(Gia_Man_t *p,int nRemPis)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  long lVar13;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar12 = 1;
    lVar13 = 0x14;
    do {
      pGVar4 = p->pObjs;
      uVar5 = *(ulong *)((long)pGVar4 + lVar13 + -8);
      uVar7 = (uint)uVar5;
      iVar8 = (int)(uVar5 & 0x1fffffff);
      uVar2 = (uint)(uVar5 >> 0x20);
      if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
        if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
          if (-1 < (int)uVar7) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          if ((int)(uVar2 & 0x1fffffff) < p->vCis->nSize - nRemPis) {
            pGVar11 = Gia_ManAppendObj(p_00);
            uVar5 = *(ulong *)pGVar11;
            *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
            *(ulong *)pGVar11 =
                 uVar5 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar6 = p_00->pObjs;
            if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001da512:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
            pGVar6 = p_00->pObjs;
            if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001da512;
            iVar8 = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
            goto LAB_001da4bc;
          }
        }
        if ((int)uVar7 < 0 && iVar8 != 0x1fffffff) {
          uVar2 = *(uint *)((long)pGVar4 + lVar13 + (ulong)(uint)(iVar8 << 2) * -3);
          if ((int)uVar2 < 0) {
LAB_001da4f3:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar8 = Gia_ManAppendCo(p_00,uVar2 ^ uVar7 >> 0x1d & 1);
          goto LAB_001da4bc;
        }
      }
      else {
        uVar7 = *(uint *)((long)pGVar4 + lVar13 + (ulong)(uint)(iVar8 << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar13 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001da4f3;
        iVar8 = Gia_ManAppendAnd(p_00,uVar7 ^ (uint)(uVar5 >> 0x1d) & 1,uVar1 ^ uVar2 >> 0x1d & 1);
LAB_001da4bc:
        *(int *)(&pGVar4->field_0x0 + lVar13) = iVar8;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupRemovePis( Gia_Man_t * p, int nRemPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) < Gia_ManCiNum(p)-nRemPis )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}